

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# common-whisper.cpp
# Opt level: O1

bool read_audio_data(string *fname,vector<float,_std::allocator<float>_> *pcmf32,
                    vector<std::vector<float,_std::allocator<float>_>,_std::allocator<std::vector<float,_std::allocator<float>_>_>_>
                    *pcmf32s,bool stereo)

{
  pointer pfVar1;
  pointer pvVar2;
  long lVar3;
  long lVar4;
  FILE *pFVar5;
  int iVar6;
  ma_result mVar7;
  size_t sVar8;
  char *pcVar9;
  undefined7 in_register_00000009;
  bool bVar10;
  ma_uint64 mVar11;
  char *pcVar12;
  vector<unsigned_char,_std::allocator<unsigned_char>_> audio_data;
  ma_uint64 frames_read;
  ma_uint64 frame_count;
  ma_decoder decoder;
  void *local_718;
  long lStack_710;
  long local_708;
  vector<std::vector<float,_std::allocator<float>_>,_std::allocator<std::vector<float,_std::allocator<float>_>_>_>
  *local_6f8;
  ma_uint64 local_6f0;
  ma_decoder_config local_6e8;
  ma_uint64 local_658 [2];
  undefined4 local_648;
  undefined4 uStack_644;
  undefined4 uStack_640;
  undefined4 uStack_63c;
  undefined4 local_638;
  undefined4 uStack_634;
  undefined4 uStack_630;
  undefined4 uStack_62c;
  undefined4 uStack_628;
  undefined8 local_624;
  ma_decoder local_258;
  
  local_718 = (void *)0x0;
  lStack_710 = 0;
  local_708 = 0;
  local_6e8.channels = (int)CONCAT71(in_register_00000009,stereo) + 1;
  local_648 = 0;
  local_658[0] = 0;
  local_658[1] = 0;
  local_6e8.allocationCallbacks.pUserData = (void *)0x0;
  local_6e8.allocationCallbacks.onMalloc = (_func_void_ptr_size_t_void_ptr *)0x0;
  local_6e8.allocationCallbacks.onRealloc = (_func_void_ptr_void_ptr_size_t_void_ptr *)0x0;
  local_6e8.allocationCallbacks.onFree = (_func_void_void_ptr_void_ptr *)0x0;
  local_6e8._116_8_ = 0;
  local_6e8.ppCustomBackendVTables._4_4_ = 0;
  local_6e8.customBackendCount = 0;
  local_6e8._132_4_ = 0;
  local_6e8.pCustomBackendUserData = (void *)0x0;
  uStack_644 = 0;
  uStack_640 = 0;
  uStack_63c = 0;
  local_638 = 0;
  uStack_634 = 0;
  uStack_630 = 0;
  uStack_62c = 0;
  uStack_628 = 0;
  local_624 = 0;
  local_6e8.format = ma_format_f32;
  local_6e8.sampleRate = 16000;
  local_6e8._12_8_ = 0;
  local_6e8._20_8_ = 0;
  local_6e8.ditherMode = ma_dither_mode_none;
  local_6e8.resampling.format = ma_format_unknown;
  local_6e8.resampling.channels = 0;
  local_6e8.resampling.sampleRateIn = 0;
  local_6e8.resampling.sampleRateOut = 0;
  local_6e8.resampling.algorithm = ma_resample_algorithm_linear;
  local_6e8.resampling._20_4_ = 0;
  local_6e8.resampling.pBackendVTable._0_4_ = 0;
  local_6e8.resampling.pBackendVTable._4_4_ = 0;
  local_6e8.resampling.pBackendUserData = (void *)0x0;
  local_6e8.resampling.linear.lpfOrder = 4;
  local_6e8.resampling._44_4_ = 0;
  local_6e8.encodingFormat = ma_encoding_format_unknown;
  iVar6 = std::__cxx11::string::compare((char *)fname);
  if (iVar6 == 0) {
    local_6f8 = pcmf32s;
    do {
      sVar8 = fread(local_658,1,0x400,_stdin);
      if (sVar8 == 0) break;
      std::vector<unsigned_char,std::allocator<unsigned_char>>::_M_range_insert<unsigned_char*>
                ((vector<unsigned_char,std::allocator<unsigned_char>> *)&local_718,lStack_710,
                 local_658,(long)local_658 + sVar8);
    } while (sVar8 != 0);
    mVar7 = ma_decoder_init_memory(local_718,lStack_710 - (long)local_718,&local_6e8,&local_258);
    pcmf32s = local_6f8;
    pFVar5 = _stderr;
    if (mVar7 != MA_SUCCESS) {
      pcVar12 = ma_result_description(mVar7);
      fprintf(pFVar5,"Error: failed to open audio data from stdin (%s)\n",pcVar12);
      goto LAB_0017e4d8;
    }
    fprintf(_stderr,"%s: read %zu bytes from stdin\n","read_audio_data",lStack_710 - (long)local_718
           );
  }
  else {
    mVar7 = ma_decoder_init_file((fname->_M_dataplus)._M_p,&local_6e8,&local_258);
    if ((mVar7 != MA_SUCCESS) &&
       (mVar7 = ma_decoder_init_memory
                          ((fname->_M_dataplus)._M_p,fname->_M_string_length,&local_6e8,&local_258),
       mVar7 != MA_SUCCESS)) {
      read_audio_data();
LAB_0017e4d8:
      bVar10 = false;
      goto LAB_0017e3a0;
    }
  }
  mVar7 = ma_decoder_get_length_in_pcm_frames(&local_258,local_658);
  if (mVar7 == MA_SUCCESS) {
    std::vector<float,_std::allocator<float>_>::resize(pcmf32,local_658[0] << (stereo & 0x3fU));
    mVar7 = ma_decoder_read_pcm_frames
                      (&local_258,
                       (pcmf32->super__Vector_base<float,_std::allocator<float>_>)._M_impl.
                       super__Vector_impl_data._M_start,local_658[0],&local_6f0);
    if (mVar7 == MA_SUCCESS) {
      if (stereo) {
        std::
        vector<std::vector<float,_std::allocator<float>_>,_std::allocator<std::vector<float,_std::allocator<float>_>_>_>
        ::resize(pcmf32s,2);
        std::vector<float,_std::allocator<float>_>::resize
                  ((pcmf32s->
                   super__Vector_base<std::vector<float,_std::allocator<float>_>,_std::allocator<std::vector<float,_std::allocator<float>_>_>_>
                   )._M_impl.super__Vector_impl_data._M_start,local_658[0]);
        std::vector<float,_std::allocator<float>_>::resize
                  ((pcmf32s->
                   super__Vector_base<std::vector<float,_std::allocator<float>_>,_std::allocator<std::vector<float,_std::allocator<float>_>_>_>
                   )._M_impl.super__Vector_impl_data._M_start + 1,local_658[0]);
        if (local_658[0] != 0) {
          pfVar1 = (pcmf32->super__Vector_base<float,_std::allocator<float>_>)._M_impl.
                   super__Vector_impl_data._M_start;
          pvVar2 = (pcmf32s->
                   super__Vector_base<std::vector<float,_std::allocator<float>_>,_std::allocator<std::vector<float,_std::allocator<float>_>_>_>
                   )._M_impl.super__Vector_impl_data._M_start;
          lVar3 = *(long *)&(pvVar2->super__Vector_base<float,_std::allocator<float>_>)._M_impl.
                            super__Vector_impl_data;
          lVar4 = *(long *)&pvVar2[1].super__Vector_base<float,_std::allocator<float>_>._M_impl.
                            super__Vector_impl_data;
          mVar11 = 0;
          do {
            *(float *)(lVar3 + mVar11 * 4) = pfVar1[mVar11 * 2];
            *(float *)(lVar4 + mVar11 * 4) = pfVar1[mVar11 * 2 + 1];
            mVar11 = mVar11 + 1;
          } while (local_658[0] != mVar11);
        }
      }
      bVar10 = true;
      ma_decoder_uninit(&local_258);
      goto LAB_0017e3a0;
    }
    pcVar12 = "error: failed to read the frames of the audio data (%s)\n";
  }
  else {
    pcVar12 = "error: failed to retrieve the length of the audio data (%s)\n";
  }
  pFVar5 = _stderr;
  pcVar9 = ma_result_description(mVar7);
  bVar10 = false;
  fprintf(pFVar5,pcVar12,pcVar9);
LAB_0017e3a0:
  if (local_718 != (void *)0x0) {
    operator_delete(local_718,local_708 - (long)local_718);
  }
  return bVar10;
}

Assistant:

bool read_audio_data(const std::string & fname, std::vector<float>& pcmf32, std::vector<std::vector<float>>& pcmf32s, bool stereo) {
    std::vector<uint8_t> audio_data; // used for pipe input from stdin or ffmpeg decoding output

    ma_result result;
    ma_decoder_config decoder_config;
    ma_decoder decoder;

    decoder_config = ma_decoder_config_init(ma_format_f32, stereo ? 2 : 1, WHISPER_SAMPLE_RATE);

    if (fname == "-") {
		#ifdef _WIN32
		_setmode(_fileno(stdin), _O_BINARY);
		#endif

		uint8_t buf[1024];
		while (true)
		{
			const size_t n = fread(buf, 1, sizeof(buf), stdin);
			if (n == 0) {
				break;
			}
			audio_data.insert(audio_data.end(), buf, buf + n);
		}

		if ((result = ma_decoder_init_memory(audio_data.data(), audio_data.size(), &decoder_config, &decoder)) != MA_SUCCESS) {

			fprintf(stderr, "Error: failed to open audio data from stdin (%s)\n", ma_result_description(result));

			return false;
		}

		fprintf(stderr, "%s: read %zu bytes from stdin\n", __func__, audio_data.size());
    }
    else if (((result = ma_decoder_init_file(fname.c_str(), &decoder_config, &decoder)) != MA_SUCCESS)) {
#if defined(WHISPER_FFMPEG)
		if (ffmpeg_decode_audio(fname, audio_data) != 0) {
			fprintf(stderr, "error: failed to ffmpeg decode '%s'\n", fname.c_str());

			return false;
		}

		if ((result = ma_decoder_init_memory(audio_data.data(), audio_data.size(), &decoder_config, &decoder)) != MA_SUCCESS) {
			fprintf(stderr, "error: failed to read audio data as wav (%s)\n", ma_result_description(result));

			return false;
		}
#else
		if ((result = ma_decoder_init_memory(fname.c_str(), fname.size(), &decoder_config, &decoder)) != MA_SUCCESS) {
			fprintf(stderr, "error: failed to read audio data as wav (%s)\n", ma_result_description(result));

			return false;
		}
#endif
    }

    ma_uint64 frame_count;
    ma_uint64 frames_read;

    if ((result = ma_decoder_get_length_in_pcm_frames(&decoder, &frame_count)) != MA_SUCCESS) {
		fprintf(stderr, "error: failed to retrieve the length of the audio data (%s)\n", ma_result_description(result));

		return false;
    }

    pcmf32.resize(stereo ? frame_count*2 : frame_count);

    if ((result = ma_decoder_read_pcm_frames(&decoder, pcmf32.data(), frame_count, &frames_read)) != MA_SUCCESS) {
		fprintf(stderr, "error: failed to read the frames of the audio data (%s)\n", ma_result_description(result));

		return false;
    }

    if (stereo) {
		pcmf32s.resize(2);
		pcmf32s[0].resize(frame_count);
		pcmf32s[1].resize(frame_count);
		for (uint64_t i = 0; i < frame_count; i++) {
			pcmf32s[0][i] = pcmf32[2*i];
			pcmf32s[1][i] = pcmf32[2*i + 1];
		}
    }

    ma_decoder_uninit(&decoder);

    return true;
}